

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

void idx2::AllocPtr<idx2::sub_channel>(sub_channel **Ptr,i64 Size,allocator *Alloc)

{
  undefined1 local_48 [8];
  buffer RawBuf;
  allocator *Alloc_local;
  i64 Size_local;
  sub_channel **Ptr_local;
  
  RawBuf.Alloc = Alloc;
  RawBuf.Bytes = (i64)Mallocator();
  local_48 = (undefined1  [8])0x0;
  RawBuf.Data = (byte *)0x0;
  AllocBuf((buffer *)local_48,Size * 0x70,RawBuf.Alloc);
  *Ptr = (sub_channel *)local_48;
  return;
}

Assistant:

void
AllocPtr(t** Ptr, i64 Size, allocator* Alloc = &Mallocator())
{
  buffer RawBuf;
  AllocBuf(&RawBuf, i64(Size * sizeof(t)), Alloc);
  *Ptr = (t*)RawBuf.Data;
}